

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampler.cc
# Opt level: O1

ssize_t __thiscall tcmalloc::Sampler::PickNextSamplingPoint(Sampler *this)

{
  ssize_t sVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  if (FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
      FLAGS_tcmalloc_sample_parameter < 1) {
    sVar1 = 0x1000000;
  }
  else {
    uVar2 = this->rnd_ * 0x5deece66d + 0xb & 0xffffffffffff;
    this->rnd_ = uVar2;
    dVar3 = log2((double)((int)(uVar2 >> 0x16) + 1));
    dVar4 = (double)FLAG__namespace_do_not_use_directly_use_DECLARE_int64_t_instead::
                    FLAGS_tcmalloc_sample_parameter * -0.6931471805599453 * (dVar3 + -26.0);
    dVar3 = 9.223372036854776e+18;
    if (dVar4 <= 9.223372036854776e+18) {
      dVar3 = dVar4;
    }
    sVar1 = (ssize_t)dVar3;
  }
  return sVar1;
}

Assistant:

ssize_t Sampler::PickNextSamplingPoint() {
  if (FLAGS_tcmalloc_sample_parameter <= 0) {
    // In this case, we don't want to sample ever, and the larger a
    // value we put here, the longer until we hit the slow path
    // again. However, we have to support the flag changing at
    // runtime, so pick something reasonably large (to keep overhead
    // low) but small enough that we'll eventually start to sample
    // again.
    return 16 << 20;
  }

  rnd_ = NextRandom(rnd_);
  // Take the top 26 bits as the random number
  // (This plus the 1<<58 sampling bound give a max possible step of
  // 5194297183973780480 bytes.)
  const uint64_t prng_mod_power = 48;  // Number of bits in prng
  // The uint32_t cast is to prevent a (hard-to-reproduce) NAN
  // under piii debug for some binaries.
  double q = static_cast<uint32_t>(rnd_ >> (prng_mod_power - 26)) + 1.0;
  // Put the computed p-value through the CDF of a geometric.
  double interval =
      (log2(q) - 26) * (-log(2.0) * FLAGS_tcmalloc_sample_parameter);

  // Very large values of interval overflow ssize_t. If we happen to
  // hit such improbable condition, we simply cheat and clamp interval
  // to largest supported value.
  return static_cast<ssize_t>(
    std::min<double>(interval, static_cast<double>(kMaxSSize)));
}